

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O0

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
flatten_projection::evaluate
          (flatten_projection *this,reference val,
          eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          *context,error_code *ec)

{
  bool bVar1;
  iterator this_00;
  json_const_pointer_arg_t *args;
  reference pbVar2;
  __normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *in_RDI;
  reference j_1;
  reference j;
  reference elem;
  iterator __end0_1;
  iterator __begin0_1;
  const_array_range_type *__range6;
  reference current_elem;
  iterator __end0;
  iterator __begin0;
  const_array_range_type *__range4;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *result;
  reference in_stack_ffffffffffffff50;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff60;
  error_code *in_stack_ffffffffffffff68;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff70;
  iterator in_stack_ffffffffffffff78;
  iterator in_stack_ffffffffffffff80;
  const_array_range_type local_78;
  range<__gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  *in_stack_ffffffffffffff98;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  __normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  local_50;
  const_array_range_type local_48;
  range<__gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  *local_38;
  reference local_30;
  reference local_8;
  
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     in_stack_ffffffffffffff68);
  if (bVar1) {
    local_30 = eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
               ::create_json<jsoncons::json_array_arg_t_const&>
                         ((eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                           *)in_stack_ffffffffffffff80._M_current,
                          (json_array_arg_t *)in_stack_ffffffffffffff78._M_current);
    local_48 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
                         (in_stack_ffffffffffffffa0);
    local_38 = &local_48;
    local_50._M_current =
         (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
         range<__gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
         ::begin(local_38);
    this_00 = range<__gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
              ::end(local_38);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                               *)in_stack_ffffffffffffff50,in_RDI), bVar1) {
      args = (json_const_pointer_arg_t *)
             __gnu_cxx::
             __normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
             ::operator*(&local_50);
      bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         in_stack_ffffffffffffff68);
      if (bVar1) {
        local_78 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
                             ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                              args);
        in_stack_ffffffffffffff98 = &local_78;
        in_stack_ffffffffffffff80 =
             range<__gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
             ::begin(in_stack_ffffffffffffff98);
        in_stack_ffffffffffffff78 =
             range<__gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
             ::end(in_stack_ffffffffffffff98);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                                   *)in_stack_ffffffffffffff50,in_RDI), bVar1) {
          in_stack_ffffffffffffff70 =
               (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *)__gnu_cxx::
                  __normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                  ::operator*((__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                               *)&stack0xffffffffffffff80);
          bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_null
                            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                             in_stack_ffffffffffffff68);
          if (!bVar1) {
            in_stack_ffffffffffffff68 =
                 (error_code *)
                 projection_base::apply_expressions
                           ((projection_base *)in_stack_ffffffffffffff80._M_current,
                            in_stack_ffffffffffffff78._M_current,in_stack_ffffffffffffff70,
                            in_stack_ffffffffffffff68);
            bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_null
                              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                               in_stack_ffffffffffffff68);
            if (!bVar1) {
              basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
              emplace_back<jsoncons::json_const_pointer_arg_t_const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const*>
                        (this_00._M_current,args,
                         (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)
                         in_stack_ffffffffffffff98);
            }
          }
          __gnu_cxx::
          __normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          ::operator++((__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                        *)&stack0xffffffffffffff80);
        }
      }
      else {
        bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_null
                          ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                           in_stack_ffffffffffffff68);
        if (!bVar1) {
          pbVar2 = projection_base::apply_expressions
                             ((projection_base *)in_stack_ffffffffffffff80._M_current,
                              in_stack_ffffffffffffff78._M_current,in_stack_ffffffffffffff70,
                              in_stack_ffffffffffffff68);
          bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_null
                            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                             in_stack_ffffffffffffff68);
          if (!bVar1) {
            basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
            emplace_back<jsoncons::json_const_pointer_arg_t_const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const*>
                      (this_00._M_current,args,
                       (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)
                       in_stack_ffffffffffffff98);
            in_stack_ffffffffffffff50 = pbVar2;
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
      ::operator++(&local_50);
    }
    local_8 = local_30;
  }
  else {
    local_8 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              ::null_value(in_stack_ffffffffffffff60);
  }
  return local_8;
}

Assistant:

reference evaluate(reference val, eval_context<Json>& context, std::error_code& ec) const override
            {
                if (!val.is_array())
                {
                    return context.null_value();
                }

                auto result = context.create_json(json_array_arg);
                for (reference current_elem : val.array_range())
                {
                    if (current_elem.is_array())
                    {
                        for (reference elem : current_elem.array_range())
                        {
                            if (!elem.is_null())
                            {
                                reference j = this->apply_expressions(elem, context, ec);
                                if (!j.is_null())
                                {
                                    result->emplace_back(json_const_pointer_arg, std::addressof(j));
                                }
                            }
                        }
                    }
                    else
                    {
                        if (!current_elem.is_null())
                        {
                            reference j = this->apply_expressions(current_elem, context, ec);
                            if (!j.is_null())
                            {
                                result->emplace_back(json_const_pointer_arg, std::addressof(j));
                            }
                        }
                    }
                }
                return *result;
            }